

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_longest_match_quickly_inc.h
# Opt level: O0

void InitEmptyH54(H54 *self)

{
  H54 *self_local;
  
  if (self->is_dirty_ != 0) {
    memset(self,0,0x400010);
    self->is_dirty_ = 0;
  }
  return;
}

Assistant:

static void FN(InitEmpty)(HashLongestMatchQuickly* self) {
  if (self->is_dirty_) {
    /* It is not strictly necessary to fill this buffer here, but
       not filling will make the results of the compression stochastic
       (but correct). This is because random data would cause the
       system to find accidentally good backward references here and there. */
    memset(&self->buckets_[0], 0, sizeof(self->buckets_));
    self->is_dirty_ = BROTLI_FALSE;
  }
}